

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_fader_get_data_format
               (ma_fader *pFader,ma_format *pFormat,ma_uint32 *pChannels,ma_uint32 *pSampleRate)

{
  if (pFader != (ma_fader *)0x0) {
    if (pFormat != (ma_format *)0x0) {
      *pFormat = (pFader->config).format;
    }
    if (pChannels != (ma_uint32 *)0x0) {
      *pChannels = (pFader->config).channels;
    }
    if (pSampleRate != (ma_uint32 *)0x0) {
      *pSampleRate = (pFader->config).sampleRate;
    }
  }
  return;
}

Assistant:

MA_API void ma_fader_get_data_format(const ma_fader* pFader, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate)
{
    if (pFader == NULL) {
        return;
    }

    if (pFormat != NULL) {
        *pFormat = pFader->config.format;
    }

    if (pChannels != NULL) {
        *pChannels = pFader->config.channels;
    }

    if (pSampleRate != NULL) {
        *pSampleRate = pFader->config.sampleRate;
    }
}